

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O1

BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> * __thiscall
flow::IRBuilder::
insert<flow::BinaryInstr<(flow::BinaryOperator)26,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
          (IRBuilder *this,Value **args,Value **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  tuple<flow::Instr_*,_std::default_delete<flow::Instr>_> this_00;
  BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *pBVar1;
  __uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> local_30;
  
  this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
  super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)operator_new(0x70);
  BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1>::BinaryInstr
            ((BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *)
             this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
             super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl,*args,*args_1,args_2);
  local_30._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
  super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
       (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)
       (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)
       this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
       super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
  pBVar1 = (BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *)
           insert(this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_30);
  if ((_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)
      local_30._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
      super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != (Instr *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                          super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl + 8))();
  }
  return pBVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }